

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customObjectParameterSucceeds_TestShell::
~TEST_MockComparatorCopierTest_customObjectParameterSucceeds_TestShell
          (TEST_MockComparatorCopierTest_customObjectParameterSucceeds_TestShell *this)

{
  TEST_MockComparatorCopierTest_customObjectParameterSucceeds_TestShell *this_local;
  
  ~TEST_MockComparatorCopierTest_customObjectParameterSucceeds_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectParameterSucceeds)
{
    MyTypeForTesting object(1);
    MyTypeForTestingComparator comparator;
    mock().installComparator("MyTypeForTesting", comparator);

    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();

    mock().removeAllComparatorsAndCopiers();
}